

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linuxaio_queue.cpp
# Opt level: O3

void * foxxll::linuxaio_queue::post_async(void *arg)

{
  value_type local_c;
  
  post_requests((linuxaio_queue *)arg);
  local_c = TERMINATED;
  shared_state<foxxll::request_queue_impl_worker::thread_state>::set_to
            ((shared_state<foxxll::request_queue_impl_worker::thread_state> *)((long)arg + 0x188),
             &local_c);
  return (void *)0x0;
}

Assistant:

void* linuxaio_queue::post_async(void* arg)
{
    (static_cast<linuxaio_queue*>(arg))->post_requests();

    self_type* pthis = static_cast<self_type*>(arg);
    pthis->post_thread_state_.set_to(TERMINATED);

#if FOXXLL_MSVC >= 1700 && FOXXLL_MSVC <= 1800
    // Workaround for deadlock bug in Visual C++ Runtime 2012 and 2013, see
    // request_queue_impl_worker.cpp. -tb
    ExitThread(nullptr);
#else
    return nullptr;
#endif
}